

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void delete_if_statement(Context_conflict *ctx,MOJOSHADER_astIfStatement *stmt)

{
  MOJOSHADER_astIfStatement *stmt_local;
  Context_conflict *ctx_local;
  
  if (stmt != (MOJOSHADER_astIfStatement *)0x0) {
    delete_statement(ctx,stmt->next);
    delete_expr(ctx,stmt->expr);
    delete_statement(ctx,stmt->statement);
    delete_statement(ctx,stmt->else_statement);
    Free(ctx,stmt);
  }
  return;
}

Assistant:

static void delete_if_statement(Context *ctx, MOJOSHADER_astIfStatement *stmt)
{
    DELETE_AST_NODE(stmt);
    delete_statement(ctx, stmt->next);
    delete_expr(ctx, stmt->expr);
    delete_statement(ctx, stmt->statement);
    delete_statement(ctx, stmt->else_statement);
    Free(ctx, stmt);
}